

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLVersionParser.cpp
# Opt level: O2

void __thiscall
COLLADASaxFWL::VersionParser::VersionParser
          (VersionParser *this,IErrorHandler *errorHandler,FileLoader *fileLoader,int flags,
          int *parsedFlags)

{
  _Rb_tree_header *p_Var1;
  
  GeneratedSaxParser::Parser::Parser(&this->super_Parser,errorHandler);
  (this->super_Parser)._vptr_Parser = (_func_int **)&PTR__VersionParser_00953f68;
  p_Var1 = &(this->mFunctionMap14)._M_t._M_impl.super__Rb_tree_header;
  (this->mFunctionMap14)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mFunctionMap14)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mFunctionMap14)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mFunctionMap14)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mFunctionMap14)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->mFunctionMap15)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mFunctionMap15)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->mFunctionMap15)._M_t._M_impl.super__Rb_tree_header;
  (this->mFunctionMap15)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mFunctionMap15)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  this->mPrivateParser15 = (ColladaParserAutoGen15Private *)0x0;
  (this->mFunctionMap15)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->mPrivateParser14 = (ColladaParserAutoGen14Private *)0x0;
  this->mFileLoader = fileLoader;
  this->mFlags = flags;
  this->mParsedFlags = parsedFlags;
  return;
}

Assistant:

VersionParser::VersionParser(GeneratedSaxParser::IErrorHandler* errorHandler,
        FileLoader* fileLoader,
        int flags,
        int& parsedFlags)
        : GeneratedSaxParser::Parser( errorHandler )
        , mPrivateParser14( 0 )
        , mPrivateParser15( 0 )
        , mFileLoader( fileLoader )
        , mFlags( flags )
        , mParsedFlags( parsedFlags )
    {

    }